

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

xmlRelaxNGDefinePtr_conflict xmlRelaxNGParseInterleave(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr node)

{
  int iVar1;
  xmlRelaxNGDefinePtr_conflict payload;
  xmlHashTablePtr pxVar2;
  xmlRelaxNGDefinePtr pxVar3;
  xmlRelaxNGDefinePtr *ppxVar4;
  xmlRelaxNGDefinePtr pxVar5;
  _xmlNode *node_00;
  char name [32];
  xmlChar axStack_58 [40];
  
  payload = xmlRelaxNGNewDefine(ctxt,node);
  if (payload == (xmlRelaxNGDefinePtr_conflict)0x0) {
    return (xmlRelaxNGDefinePtr_conflict)0x0;
  }
  payload->type = XML_RELAXNG_INTERLEAVE;
  if (ctxt->interleaves == (xmlHashTablePtr)0x0) {
    pxVar2 = xmlHashCreate(10);
    ctxt->interleaves = pxVar2;
    if (pxVar2 == (xmlHashTablePtr)0x0) {
      xmlRngPErrMemory(ctxt);
      goto LAB_0018a1cd;
    }
  }
  ctxt->nbInterleaves = ctxt->nbInterleaves + 1;
  snprintf((char *)axStack_58,0x20,"interleave%d");
  iVar1 = xmlHashAddEntry(ctxt->interleaves,axStack_58,payload);
  if (iVar1 < 0) {
    xmlRngPErr(ctxt,node,0x415,"Failed to add %s to hash table\n",axStack_58,(xmlChar *)0x0);
  }
LAB_0018a1cd:
  node_00 = node->children;
  if (node_00 == (_xmlNode *)0x0) {
    xmlRngPErr(ctxt,node,0x418,"Element interleave is empty\n",(xmlChar *)0x0,(xmlChar *)0x0);
  }
  else {
    pxVar5 = (xmlRelaxNGDefinePtr)0x0;
    do {
      if ((((node_00->ns == (xmlNs *)0x0) || (node_00->type != XML_ELEMENT_NODE)) ||
          (iVar1 = xmlStrEqual(node_00->name,"element"), iVar1 == 0)) ||
         (iVar1 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
         iVar1 == 0)) {
        pxVar3 = xmlRelaxNGParsePattern(ctxt,node_00);
      }
      else {
        pxVar3 = xmlRelaxNGParseElement(ctxt,node_00);
      }
      if (pxVar3 != (xmlRelaxNGDefinePtr)0x0) {
        pxVar3->parent = payload;
        ppxVar4 = &pxVar5->next;
        if (pxVar5 == (xmlRelaxNGDefinePtr)0x0) {
          ppxVar4 = &payload->content;
        }
        *ppxVar4 = pxVar3;
        pxVar5 = pxVar3;
      }
      node_00 = node_00->next;
    } while (node_00 != (_xmlNode *)0x0);
  }
  return payload;
}

Assistant:

static xmlRelaxNGDefinePtr
xmlRelaxNGParseInterleave(xmlRelaxNGParserCtxtPtr ctxt, xmlNodePtr node)
{
    xmlRelaxNGDefinePtr def = NULL;
    xmlRelaxNGDefinePtr last = NULL, cur;
    xmlNodePtr child;

    def = xmlRelaxNGNewDefine(ctxt, node);
    if (def == NULL) {
        return (NULL);
    }
    def->type = XML_RELAXNG_INTERLEAVE;

    if (ctxt->interleaves == NULL)
        ctxt->interleaves = xmlHashCreate(10);
    if (ctxt->interleaves == NULL) {
        xmlRngPErrMemory(ctxt);
    } else {
        char name[32];

        snprintf(name, 32, "interleave%d", ctxt->nbInterleaves++);
        if (xmlHashAddEntry(ctxt->interleaves, BAD_CAST name, def) < 0) {
            xmlRngPErr(ctxt, node, XML_RNGP_INTERLEAVE_ADD,
                       "Failed to add %s to hash table\n",
		       (const xmlChar *) name, NULL);
        }
    }
    child = node->children;
    if (child == NULL) {
        xmlRngPErr(ctxt, node, XML_RNGP_INTERLEAVE_NO_CONTENT,
                   "Element interleave is empty\n", NULL, NULL);
    }
    while (child != NULL) {
        if (IS_RELAXNG(child, "element")) {
            cur = xmlRelaxNGParseElement(ctxt, child);
        } else {
            cur = xmlRelaxNGParsePattern(ctxt, child);
        }
        if (cur != NULL) {
            cur->parent = def;
            if (last == NULL) {
                def->content = last = cur;
            } else {
                last->next = cur;
                last = cur;
            }
        }
        child = child->next;
    }

    return (def);
}